

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::MessageDifferencerTest_RepeatedFieldMapTest_Partial_Test::TestBody
          (MessageDifferencerTest_RepeatedFieldMapTest_Partial_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  void *pvVar3;
  FieldDescriptor *field;
  FieldDescriptor *key;
  Arena *pAVar4;
  pointer *__ptr;
  char *in_R9;
  pointer *__ptr_2;
  string_view value;
  string_view value_00;
  string_view value_01;
  AssertionResult gtest_ar_;
  TestDiffMessage msg1;
  TestDiffMessage msg2;
  MessageDifferencer differencer;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_388;
  AssertHelper local_380;
  string local_378;
  undefined1 local_358 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_350;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_348;
  undefined1 local_338 [184];
  undefined1 local_280 [184];
  MessageDifferencer local_1c8;
  
  proto2_unittest::TestDiffMessage::TestDiffMessage((TestDiffMessage *)local_338,(Arena *)0x0);
  pvVar3 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)(local_338 + 0x30),
                      Arena::DefaultConstruct<proto2_unittest::TestDiffMessage_Item>);
  *(undefined4 *)((long)pvVar3 + 0x98) = 1;
  *(byte *)((long)pvVar3 + 0x10) = *(byte *)((long)pvVar3 + 0x10) | 5;
  pAVar4 = *(Arena **)((long)pvVar3 + 8);
  if (((ulong)pAVar4 & 1) != 0) {
    pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
  }
  value._M_str = "11";
  value._M_len = 2;
  protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)((long)pvVar3 + 0x88),value,pAVar4);
  proto2_unittest::TestDiffMessage::TestDiffMessage((TestDiffMessage *)local_280,(Arena *)0x0);
  pvVar3 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)(local_280 + 0x30),
                      Arena::DefaultConstruct<proto2_unittest::TestDiffMessage_Item>);
  *(undefined4 *)((long)pvVar3 + 0x98) = 2;
  *(byte *)((long)pvVar3 + 0x10) = *(byte *)((long)pvVar3 + 0x10) | 5;
  pAVar4 = *(Arena **)((long)pvVar3 + 8);
  if (((ulong)pAVar4 & 1) != 0) {
    pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
  }
  value_00._M_str = "22";
  value_00._M_len = 2;
  protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)((long)pvVar3 + 0x88),value_00,pAVar4);
  pvVar3 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)(local_280 + 0x30),
                      Arena::DefaultConstruct<proto2_unittest::TestDiffMessage_Item>);
  *(undefined4 *)((long)pvVar3 + 0x98) = 1;
  *(byte *)((long)pvVar3 + 0x10) = *(byte *)((long)pvVar3 + 0x10) | 5;
  pAVar4 = *(Arena **)((long)pvVar3 + 8);
  if (((ulong)pAVar4 & 1) != 0) {
    pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
  }
  value_01._M_str = "11";
  value_01._M_len = 2;
  protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)((long)pvVar3 + 0x88),value_01,pAVar4);
  util::MessageDifferencer::MessageDifferencer(&local_1c8);
  paVar1 = &local_378.field_2;
  local_378._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,"item","");
  field = GetFieldDescriptor((Message *)local_338,&local_378);
  local_358 = (undefined1  [8])&local_348;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_358,"item.a","");
  key = GetFieldDescriptor((Message *)local_338,(string *)local_358);
  util::MessageDifferencer::TreatAsMap(&local_1c8,field,key);
  if (local_358 != (undefined1  [8])&local_348) {
    operator_delete((void *)local_358,local_348._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._M_dataplus._M_p != paVar1) {
    operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
  }
  util::MessageDifferencer::set_scope(&local_1c8,PARTIAL);
  bVar2 = util::MessageDifferencer::Compare(&local_1c8,(Message *)local_338,(Message *)local_280);
  local_358[0] = bVar2;
  local_350 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar2) {
    testing::Message::Message((Message *)&local_388);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_378,(internal *)local_358,(AssertionResult *)0x126d6fd,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x7eb,local_378._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_380,(Message *)&local_388);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378._M_dataplus._M_p != paVar1) {
      operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
    }
    if (local_388._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_388._M_head_impl + 8))();
    }
  }
  if (local_350 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_350,local_350);
  }
  util::MessageDifferencer::~MessageDifferencer(&local_1c8);
  proto2_unittest::TestDiffMessage::~TestDiffMessage((TestDiffMessage *)local_280);
  proto2_unittest::TestDiffMessage::~TestDiffMessage((TestDiffMessage *)local_338);
  return;
}

Assistant:

TEST(MessageDifferencerTest, RepeatedFieldMapTest_Partial) {
  proto2_unittest::TestDiffMessage msg1;
  // message msg1 {
  //   item { a: 1; b: "11" }
  // }
  proto2_unittest::TestDiffMessage::Item* item = msg1.add_item();
  item->set_a(1);
  item->set_b("11");

  proto2_unittest::TestDiffMessage msg2;
  // message msg2 {
  //   item { a: 2; b: "22" }
  //   item { a: 1; b: "11" }
  // }
  item = msg2.add_item();
  item->set_a(2);
  item->set_b("22");
  item = msg2.add_item();
  item->set_a(1);
  item->set_b("11");

  // Compare
  util::MessageDifferencer differencer;
  differencer.TreatAsMap(GetFieldDescriptor(msg1, "item"),
                         GetFieldDescriptor(msg1, "item.a"));
  differencer.set_scope(util::MessageDifferencer::PARTIAL);
  EXPECT_TRUE(differencer.Compare(msg1, msg2));
}